

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy_csv.cpp
# Opt level: O1

void duckdb::CSVCopyFunction::RegisterFunction(BuiltinFunctions *set)

{
  size_type *psVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this;
  SimpleNamedParameterFunction local_730;
  undefined1 local_668 [216];
  element_type *local_590;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_588;
  TableFunctionInitialization local_580;
  undefined1 local_578 [256];
  string local_478 [32];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_458;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_440;
  LogicalType local_428;
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::LogicalType>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  local_410 [56];
  undefined1 local_3d8 [216];
  element_type *local_300;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_2f8;
  TableFunctionInitialization local_2f0;
  _Alloc_hider local_2e8;
  char *local_2e0;
  char local_2d8 [16];
  CopyFunction local_2c8;
  
  psVar1 = &local_730.super_SimpleFunction.super_Function.name._M_string_length;
  local_730.super_SimpleFunction.super_Function._vptr_Function = (_func_int **)psVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_730,"csv","");
  CopyFunction::CopyFunction((CopyFunction *)local_578,(string *)&local_730);
  if (local_730.super_SimpleFunction.super_Function._vptr_Function != (_func_int **)psVar1) {
    operator_delete(local_730.super_SimpleFunction.super_Function._vptr_Function);
  }
  local_578._88_8_ = WriteCSVBind;
  local_578._96_8_ = WriteCSVInitializeLocal;
  local_578._104_8_ = WriteCSVInitializeGlobal;
  local_578._120_8_ = WriteCSVSink;
  local_578._128_8_ = WriteCSVCombine;
  local_578._136_8_ = WriteCSVFinalize;
  local_578._144_8_ = WriteCSVExecutionMode;
  local_578._152_8_ = WriteCSVPrepareBatch;
  local_578._160_8_ = WriteCSVFlushBatch;
  local_578._176_8_ = WriteCSVRotateFiles;
  local_578._184_8_ = WriteCSVRotateNextFile;
  local_578._208_8_ = MultiFileFunction<duckdb::CSVMultiFileInfo>::MultiFileBindCopy;
  ReadCSVTableFunction::GetFunction();
  ::std::__cxx11::string::_M_assign((string *)(local_578 + 0xe0));
  ::std::__cxx11::string::_M_assign(local_478);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::operator=
            (&local_458,
             &local_730.super_SimpleFunction.arguments.
              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::operator=
            (&local_440,
             &local_730.super_SimpleFunction.original_arguments.
              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
  local_428.id_ = local_730.super_SimpleFunction.varargs.id_;
  local_428.physical_type_ = local_730.super_SimpleFunction.varargs.physical_type_;
  shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
            (&local_428.type_info_,&local_730.super_SimpleFunction.varargs.type_info_);
  ::std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::LogicalType>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_assign_elements<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::LogicalType>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&>
            (local_410,&local_730.named_parameters._M_h);
  switchD_012e1ce8::default(local_3d8,local_668,0xd6);
  this._M_pi = _Stack_2f8._M_pi;
  _Stack_2f8._M_pi = p_Stack_588;
  local_300 = local_590;
  local_590 = (element_type *)0x0;
  p_Stack_588 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (this._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this._M_pi);
  }
  local_2f0 = local_580;
  local_730.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__TableFunction_0247fa60;
  if (p_Stack_588 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_588);
  }
  SimpleNamedParameterFunction::~SimpleNamedParameterFunction(&local_730);
  ::std::__cxx11::string::_M_replace((ulong)&local_2e8,0,local_2e0,0x1de6e2b);
  CopyFunction::CopyFunction(&local_2c8,(CopyFunction *)local_578);
  BuiltinFunctions::AddFunction(set,&local_2c8);
  local_2c8.super_Function._vptr_Function = (_func_int **)&PTR__CopyFunction_02481010;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8.extension._M_dataplus._M_p != &local_2c8.extension.field_2) {
    operator_delete(local_2c8.extension._M_dataplus._M_p);
  }
  local_2c8.copy_from_function.super_SimpleNamedParameterFunction.super_SimpleFunction.
  super_Function._vptr_Function = (_func_int **)&PTR__TableFunction_0247fa60;
  if (local_2c8.copy_from_function.function_info.internal.
      super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2c8.copy_from_function.function_info.internal.
               super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  SimpleNamedParameterFunction::~SimpleNamedParameterFunction
            (&local_2c8.copy_from_function.super_SimpleNamedParameterFunction);
  Function::~Function(&local_2c8.super_Function);
  local_578._0_8_ = &PTR__CopyFunction_02481010;
  if (local_2e8._M_p != local_2d8) {
    operator_delete(local_2e8._M_p);
  }
  local_578._216_8_ = &PTR__TableFunction_0247fa60;
  if (_Stack_2f8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_2f8._M_pi);
  }
  SimpleNamedParameterFunction::~SimpleNamedParameterFunction
            ((SimpleNamedParameterFunction *)(local_578 + 0xd8));
  Function::~Function((Function *)local_578);
  return;
}

Assistant:

void CSVCopyFunction::RegisterFunction(BuiltinFunctions &set) {
	CopyFunction info("csv");
	info.copy_to_bind = WriteCSVBind;
	info.copy_to_initialize_local = WriteCSVInitializeLocal;
	info.copy_to_initialize_global = WriteCSVInitializeGlobal;
	info.copy_to_sink = WriteCSVSink;
	info.copy_to_combine = WriteCSVCombine;
	info.copy_to_finalize = WriteCSVFinalize;
	info.execution_mode = WriteCSVExecutionMode;
	info.prepare_batch = WriteCSVPrepareBatch;
	info.flush_batch = WriteCSVFlushBatch;
	info.rotate_files = WriteCSVRotateFiles;
	info.rotate_next_file = WriteCSVRotateNextFile;

	info.copy_from_bind = MultiFileFunction<CSVMultiFileInfo>::MultiFileBindCopy;
	info.copy_from_function = ReadCSVTableFunction::GetFunction();

	info.extension = "csv";

	set.AddFunction(info);
}